

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int Matvec_SparseCSC(SUNMatrix A,N_Vector x,N_Vector y)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  realtype *prVar5;
  realtype *prVar6;
  long *in_RDI;
  realtype *yd;
  realtype *xd;
  realtype *Ax;
  sunindextype *Ai;
  sunindextype *Ap;
  sunindextype j;
  sunindextype i;
  int local_28;
  int local_24;
  int local_4;
  
  lVar2 = *(long *)(*in_RDI + 0x28);
  lVar3 = *(long *)(*in_RDI + 0x20);
  lVar4 = *(long *)(*in_RDI + 0x10);
  if (((lVar2 == 0) || (lVar3 == 0)) || (lVar4 == 0)) {
    local_4 = -0x2be;
  }
  else {
    prVar5 = N_VGetArrayPointer((N_Vector)0xed7915);
    prVar6 = N_VGetArrayPointer((N_Vector)0xed7924);
    if (((prVar5 == (realtype *)0x0) || (prVar6 == (realtype *)0x0)) || (prVar5 == prVar6)) {
      local_4 = -0x2be;
    }
    else {
      for (local_24 = 0; local_24 < *(int *)*in_RDI; local_24 = local_24 + 1) {
        prVar6[local_24] = 0.0;
      }
      for (local_28 = 0; local_28 < *(int *)(*in_RDI + 4); local_28 = local_28 + 1) {
        for (local_24 = *(int *)(lVar2 + (long)local_28 * 4);
            local_24 < *(int *)(lVar2 + (long)(local_28 + 1) * 4); local_24 = local_24 + 1) {
          iVar1 = *(int *)(lVar3 + (long)local_24 * 4);
          prVar6[iVar1] = *(double *)(lVar4 + (long)local_24 * 8) * prVar5[local_28] + prVar6[iVar1]
          ;
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Matvec_SparseCSC(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Ai;
  realtype *Ax, *xd, *yd;

  /* access data from CSC structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Ai = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Ai == NULL) || (Ax == NULL))
    return SUNMAT_MEM_FAIL;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd) )
    return SUNMAT_MEM_FAIL;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix columns */
  for (j=0; j<SM_COLUMNS_S(A); j++) {

    /* iterate down column of A, performing product */
    for (i=Ap[j]; i<Ap[j+1]; i++)
      yd[Ai[i]] += Ax[i]*xd[j];

  }

  return SUNMAT_SUCCESS;
}